

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom.cpp
# Opt level: O0

void __thiscall md::ROM::extend(ROM *this,size_t new_size)

{
  value_type_conflict local_22 [2];
  size_type local_20;
  size_t old_size;
  size_t new_size_local;
  ROM *this_local;
  
  old_size = new_size;
  new_size_local = (size_t)this;
  local_20 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_byte_array);
  local_22[1] = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->_byte_array,old_size,local_22 + 1);
  local_22[0] = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->_original_byte_array,old_size,local_22);
  mark_empty_chunk(this,(uint32_t)local_20,(uint32_t)old_size);
  set_long(this,0x1a4,(int)old_size - 1);
  return;
}

Assistant:

void ROM::extend(size_t new_size)
{
    size_t old_size = _byte_array.size();
    _byte_array.resize(new_size, 0);
    _original_byte_array.resize(new_size, 0);
    this->mark_empty_chunk(old_size, new_size);

    this->set_long(0x1A4, new_size-1);
}